

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

bool EpsilonCompare<aiQuatKey>(aiQuatKey *n,aiQuatKey *s,ai_real epsilon)

{
  bool bVar1;
  bool local_1d;
  ai_real epsilon_local;
  aiQuatKey *s_local;
  aiQuatKey *n_local;
  
  bVar1 = EpsilonCompare((n->mValue).x,(s->mValue).x,epsilon);
  local_1d = false;
  if (bVar1) {
    bVar1 = EpsilonCompare((n->mValue).y,(s->mValue).y,epsilon);
    local_1d = false;
    if (bVar1) {
      bVar1 = EpsilonCompare((n->mValue).z,(s->mValue).z,epsilon);
      local_1d = false;
      if (bVar1) {
        local_1d = EpsilonCompare((n->mValue).w,(s->mValue).w,epsilon);
      }
    }
  }
  return local_1d;
}

Assistant:

bool EpsilonCompare<aiQuatKey>(const aiQuatKey& n, const aiQuatKey& s, ai_real epsilon)   {
    return
        EpsilonCompare(n.mValue.x,s.mValue.x,epsilon) &&
        EpsilonCompare(n.mValue.y,s.mValue.y,epsilon) &&
        EpsilonCompare(n.mValue.z,s.mValue.z,epsilon) &&
        EpsilonCompare(n.mValue.w,s.mValue.w,epsilon);
}